

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O0

Soundex * __thiscall Soundex::encodeString(Soundex *this,string *word)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  Soundex local_78 [8];
  string nextEncoding;
  char local_55;
  int local_54;
  Soundex local_50 [3];
  char c;
  int i;
  string prevEncoding;
  char local_2d [8];
  char prevChar;
  allocator local_1a;
  byte local_19;
  string *local_18;
  string *word_local;
  string *encoded;
  
  local_19 = 0;
  local_18 = word;
  word_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)word);
  iVar2 = toupper((int)*pcVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,1,(char)iVar2,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  local_2d[0] = '\0';
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
  encodeChar_abi_cxx11_(local_50,pcVar3);
  for (local_54 = 1; uVar4 = (ulong)local_54, uVar5 = std::__cxx11::string::length(), uVar4 < uVar5;
      local_54 = local_54 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    iVar2 = toupper((int)*pcVar3);
    local_55 = (char)iVar2;
    encodeChar_abi_cxx11_(local_78,&local_55);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"");
    if ((bVar1) &&
       ((bVar1 = isVowel(local_2d), bVar1 ||
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50), bVar1)))) {
      std::__cxx11::string::operator+=((string *)this,(string *)local_78);
      std::__cxx11::string::operator=((string *)local_50,(string *)local_78);
    }
    local_2d[0] = local_55;
    std::__cxx11::string::~string((string *)local_78);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string Soundex::encodeString(const string &word) {
    string encoded = string(1, toupper(word[0]));
    char prevChar = 0;
    string prevEncoding = encodeChar(encoded[0]);
    for (int i = 1; i < word.length(); i++) {
        char c = toupper(word[i]);
        string nextEncoding = encodeChar(c);
        if (nextEncoding != "" && (isVowel(prevChar) || nextEncoding != prevEncoding)) {
            encoded += nextEncoding;
            prevEncoding = nextEncoding;
        }
        prevChar = c;
    }
    return encoded;
}